

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

int Acb_ObjToGia(Gia_Man_t *pNew,Acb_Ntk_t *p,int iObj,Vec_Int_t *vTemp)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  long lVar6;
  char *__assertion;
  long lVar7;
  bool bVar8;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if (iObj < (p->vObjType).nSize) {
    if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
      __assert_fail("!Acb_ObjIsCio(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                    ,0x297,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
    }
    vTemp->nSize = 0;
    if ((p->vObjFans).nSize <= iObj) goto LAB_0036e176;
    iVar2 = (p->vObjFans).pArray[(uint)iObj];
    lVar7 = (long)iVar2;
    if ((lVar7 < 0) || ((p->vFanSto).nSize <= iVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar4 = (p->vFanSto).pArray;
    if (0 < piVar4[lVar7]) {
      lVar6 = 0;
      do {
        iVar2 = piVar4[lVar7 + lVar6 + 1];
        if ((long)iVar2 < 1) {
          __assertion = "i>0";
LAB_0036e1c4:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
        }
        iVar3 = (p->vObjCopy).nSize;
        if (iVar3 < 1) {
          __assertion = "Acb_NtkHasObjCopies(p)";
          goto LAB_0036e1c4;
        }
        if (iVar3 <= iVar2) goto LAB_0036e176;
        iVar2 = (p->vObjCopy).pArray[iVar2];
        if (iVar2 < 0) {
          __assert_fail("Acb_ObjCopy(p, iFanin) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                        ,0x29b,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
        }
        lVar6 = lVar6 + 1;
        Vec_IntPush(vTemp,iVar2);
      } while (lVar6 < piVar4[lVar7]);
    }
    if (iObj < (p->vObjType).nSize) {
      bVar1 = (p->vObjType).pArray[(uint)iObj];
      switch(bVar1) {
      case 7:
        uVar5 = 0;
        break;
      case 8:
        uVar5 = 1;
        break;
      default:
        if (bVar1 - 0xd < 2) {
          if (vTemp->nSize < 1) {
            uVar5 = 1;
          }
          else {
            uVar5 = 1;
            lVar7 = 0;
            do {
              uVar5 = Gia_ManHashAnd(pNew,uVar5,vTemp->pArray[lVar7]);
              lVar7 = lVar7 + 1;
            } while (lVar7 < vTemp->nSize);
          }
          if ((int)uVar5 < 0) goto LAB_0036e258;
          bVar8 = bVar1 == 0xe;
        }
        else if (bVar1 - 0xf < 2) {
          if (vTemp->nSize < 1) {
            uVar5 = 0;
          }
          else {
            lVar7 = 0;
            uVar5 = 0;
            do {
              uVar5 = Gia_ManHashOr(pNew,uVar5,vTemp->pArray[lVar7]);
              lVar7 = lVar7 + 1;
            } while (lVar7 < vTemp->nSize);
          }
          if ((int)uVar5 < 0) {
LAB_0036e258:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          bVar8 = bVar1 == 0x10;
        }
        else {
          if (1 < bVar1 - 0x11) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                          ,700,"int Acb_ObjToGia(Gia_Man_t *, Acb_Ntk_t *, int, Vec_Int_t *)");
          }
          if (vTemp->nSize < 1) {
            uVar5 = 0;
          }
          else {
            lVar7 = 0;
            uVar5 = 0;
            do {
              uVar5 = Gia_ManHashXor(pNew,uVar5,vTemp->pArray[lVar7]);
              lVar7 = lVar7 + 1;
            } while (lVar7 < vTemp->nSize);
          }
          if ((int)uVar5 < 0) goto LAB_0036e258;
          bVar8 = bVar1 == 0x12;
        }
        uVar5 = uVar5 ^ bVar8;
        break;
      case 0xb:
        if (vTemp->nSize < 1) {
LAB_0036e176:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar5 = *vTemp->pArray;
        break;
      case 0xc:
        if (vTemp->nSize < 1) goto LAB_0036e176;
        if (*vTemp->pArray < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x131,"int Abc_LitNot(int)");
        }
        uVar5 = *vTemp->pArray ^ 1;
      }
      return uVar5;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

int Acb_ObjToGia( Gia_Man_t * pNew, Acb_Ntk_t * p, int iObj, Vec_Int_t * vTemp )
{
    //char * pName = Abc_NamStr( p->pDesign->pStrs, Acb_ObjName(p, iObj) );
    int * pFanin, iFanin, k, Type, Res;
    assert( !Acb_ObjIsCio(p, iObj) );
    Vec_IntClear( vTemp );
    Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, k )
    {
        assert( Acb_ObjCopy(p, iFanin) >= 0 );
        Vec_IntPush( vTemp, Acb_ObjCopy(p, iFanin) );
    }
    Type = Acb_ObjType( p, iObj );
    if ( Type == ABC_OPER_CONST_F ) 
        return 0;
    if ( Type == ABC_OPER_CONST_T ) 
        return 1;
    if ( Type == ABC_OPER_BIT_BUF ) 
        return Vec_IntEntry(vTemp, 0);
    if ( Type == ABC_OPER_BIT_INV ) 
        return Abc_LitNot( Vec_IntEntry(vTemp, 0) );
    if ( Type == ABC_OPER_BIT_AND || Type == ABC_OPER_BIT_NAND )
    {
        Res = 1;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashAnd( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NAND );
    }
    if ( Type == ABC_OPER_BIT_OR || Type == ABC_OPER_BIT_NOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashOr( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NOR );
    }
    if ( Type == ABC_OPER_BIT_XOR || Type == ABC_OPER_BIT_NXOR )
    {
        Res = 0;
        Vec_IntForEachEntry( vTemp, iFanin, k )
            Res = Gia_ManHashXor( pNew, Res, iFanin );
        return Abc_LitNotCond( Res, Type == ABC_OPER_BIT_NXOR );
    }
    assert( 0 );
    return -1;
}